

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInBinary * __thiscall
chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,unsigned_long *Val)

{
  unsigned_long tmp;
  
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&tmp,8);
    StreamSwapBytes<unsigned_long>(&tmp);
    *Val = tmp;
  }
  else {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,Val,8);
  }
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(unsigned long& Val) {
    if (big_endian_machine) {
        unsigned long tmp;
        this->Input((char*)&tmp, sizeof(unsigned long));
        StreamSwapBytes<unsigned long>(&tmp);
        Val = tmp;
    } else {
        this->Input((char*)&Val, sizeof(unsigned long));
    }
    return (*this);
}